

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

LY_ERR lyplg_init(ly_bool builtin_type_plugins_only)

{
  LY_ERR local_14;
  LY_ERR ret;
  ly_bool builtin_type_plugins_only_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&plugins_guard);
  if (context_refcount == 0) {
    context_refcount = context_refcount + 1;
    local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_binary);
    if ((((((((local_14 == LY_SUCCESS) &&
             (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_bits),
             local_14 == LY_SUCCESS)) &&
            (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_boolean),
            local_14 == LY_SUCCESS)) &&
           (((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_decimal64),
             local_14 == LY_SUCCESS &&
             (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_empty),
             local_14 == LY_SUCCESS)) &&
            ((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_enumeration),
             local_14 == LY_SUCCESS &&
             ((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_identityref),
              local_14 == LY_SUCCESS &&
              (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_instanceid),
              local_14 == LY_SUCCESS)))))))) &&
          (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_integer),
          local_14 == LY_SUCCESS)) &&
         ((((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_leafref),
            local_14 == LY_SUCCESS &&
            (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_string),
            local_14 == LY_SUCCESS)) &&
           (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_union),
           local_14 == LY_SUCCESS)) &&
          ((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_metadata),
           local_14 == LY_SUCCESS &&
           (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_lyds_tree),
           local_14 == LY_SUCCESS)))))) &&
        ((builtin_type_plugins_only != '\0' ||
         ((((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_instanceid_keys),
            local_14 == LY_SUCCESS &&
            (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv4_address),
            local_14 == LY_SUCCESS)) &&
           (((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv4_address_no_zone),
             local_14 == LY_SUCCESS &&
             (((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv6_address),
               local_14 == LY_SUCCESS &&
               (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv6_address_no_zone),
               local_14 == LY_SUCCESS)) &&
              (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv4_prefix),
              local_14 == LY_SUCCESS)))) &&
            (((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv6_prefix),
              local_14 == LY_SUCCESS &&
              (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_date_and_time),
              local_14 == LY_SUCCESS)) &&
             (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_hex_string),
             local_14 == LY_SUCCESS)))))) &&
          (((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_xpath10),
            local_14 == LY_SUCCESS &&
            (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_time_period),
            local_14 == LY_SUCCESS)) &&
           (((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_node_instanceid),
             local_14 == LY_SUCCESS &&
             (((local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_nacm),
               local_14 == LY_SUCCESS &&
               (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_yangdata),
               local_14 == LY_SUCCESS)) &&
              (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_schema_mount),
              local_14 == LY_SUCCESS)))) &&
            (local_14 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_structure),
            local_14 == LY_SUCCESS)))))))))) &&
       ((local_14 = plugins_insert_dir(LYPLG_TYPE), local_14 == LY_SUCCESS &&
        (local_14 = plugins_insert_dir(LYPLG_EXTENSION), local_14 == LY_SUCCESS)))) {
      pthread_mutex_unlock((pthread_mutex_t *)&plugins_guard);
      ret = LY_SUCCESS;
    }
    else {
      lyplg_clean_();
      pthread_mutex_unlock((pthread_mutex_t *)&plugins_guard);
      if (local_14 == LY_EINVAL) {
        local_14 = LY_EINT;
      }
      ret = local_14;
    }
  }
  else {
    context_refcount = context_refcount + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&plugins_guard);
    ret = LY_SUCCESS;
  }
  return ret;
}

Assistant:

LY_ERR
lyplg_init(ly_bool builtin_type_plugins_only)
{
    LY_ERR ret;

    pthread_mutex_lock(&plugins_guard);
    /* let only the first context to initiate plugins, but let others wait for finishing the initiation */
    if (context_refcount++) {
        /* already initiated */
        pthread_mutex_unlock(&plugins_guard);
        return LY_SUCCESS;
    }

    /* internal types */
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_binary), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_bits), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_boolean), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_decimal64), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_empty), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_enumeration), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_identityref), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_instanceid), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_integer), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_leafref), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_string), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_union), error);

    /* metadata and lyds_tree, which requires them */
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_metadata), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_lyds_tree), error);

    if (!builtin_type_plugins_only) {
        /* yang */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_instanceid_keys), error);

        /* ietf-inet-types */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv4_address), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv4_address_no_zone), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv6_address), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv6_address_no_zone), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv4_prefix), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv6_prefix), error);

        /* ietf-yang-types */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_date_and_time), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_hex_string), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_xpath10), error);

        /* libnetconf2-netconf-server */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_time_period), error);

        /* ietf-netconf-acm */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_node_instanceid), error);

        /* internal extensions */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_nacm), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_yangdata), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_schema_mount), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_structure), error);
    }

#ifndef STATIC
    /* external types */
    LY_CHECK_GOTO(ret = plugins_insert_dir(LYPLG_TYPE), error);

    /* external extensions */
    LY_CHECK_GOTO(ret = plugins_insert_dir(LYPLG_EXTENSION), error);
#endif

    /* initiation done, wake-up possibly waiting threads creating another contexts */
    pthread_mutex_unlock(&plugins_guard);

    return LY_SUCCESS;

error:
    /* initiation was not successful - cleanup (and let others to try) */
#ifndef STATIC
    lyplg_clean_();
#endif
    pthread_mutex_unlock(&plugins_guard);

    if (ret == LY_EINVAL) {
        /* all the plugins here are internal, invalid record actually means an internal libyang error */
        ret = LY_EINT;
    }
    return ret;
}